

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

Cache * leveldb::NewLRUCache(size_t capacity)

{
  Cache *pCVar1;
  Cache *pCVar2;
  long lVar3;
  Rep **this;
  
  pCVar2 = (Cache *)operator_new(0xdc0);
  pCVar2->_vptr_Cache = (_func_int **)&PTR__ShardedLRUCache_001a7b50;
  lVar3 = 0xd80;
  pCVar1 = pCVar2;
  do {
    this = &pCVar1[0xd].rep_;
    *this = (Rep *)0x0;
    pCVar1[0xe]._vptr_Cache = (_func_int **)0x0;
    pCVar1[1]._vptr_Cache = (_func_int **)0x0;
    pCVar1[1].rep_ = (Rep *)0x0;
    pCVar1[2]._vptr_Cache = (_func_int **)0x0;
    pCVar1[2].rep_ = (Rep *)0x0;
    pCVar1[3]._vptr_Cache = (_func_int **)0x0;
    pCVar1[3].rep_ = (Rep *)0x0;
    pCVar1[4]._vptr_Cache = (_func_int **)0x0;
    anon_unknown_0::HandleTable::Resize((HandleTable *)this);
    pCVar1[6]._vptr_Cache = (_func_int **)&pCVar1[4].rep_;
    pCVar1[6].rep_ = (Rep *)&pCVar1[4].rep_;
    pCVar1[10].rep_ = (Rep *)(pCVar1 + 9);
    pCVar1[0xb]._vptr_Cache = (_func_int **)(pCVar1 + 9);
    lVar3 = lVar3 + -0xd8;
    pCVar1 = (Cache *)this;
  } while (lVar3 != 0);
  pCVar2[0xdb]._vptr_Cache = (_func_int **)0x0;
  pCVar2[0xdb].rep_ = (Rep *)0x0;
  pCVar2[0xda]._vptr_Cache = (_func_int **)0x0;
  pCVar2[0xda].rep_ = (Rep *)0x0;
  pCVar2[0xd9]._vptr_Cache = (_func_int **)0x0;
  pCVar2[0xd9].rep_ = (Rep *)0x0;
  lVar3 = 0x10;
  do {
    *(size_t *)((long)&pCVar2->_vptr_Cache + lVar3) = capacity + 0xf >> 4;
    lVar3 = lVar3 + 0xd8;
  } while (lVar3 != 0xd90);
  return pCVar2;
}

Assistant:

Cache* NewLRUCache(size_t capacity) { return new ShardedLRUCache(capacity); }